

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteConstant<double,int,double,duckdb::BinaryStandardOperatorWrapper,duckdb::RoundOperatorPrecision,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  duckdb::Vector::SetVectorType((VectorType)result);
  pdVar1 = *(double **)(result + 0x20);
  if (((*(byte **)(left + 0x28) == (byte *)0x0) || ((**(byte **)(left + 0x28) & 1) != 0)) &&
     ((*(byte **)(right + 0x28) == (byte *)0x0 || ((**(byte **)(right + 0x28) & 1) != 0)))) {
    dVar4 = **(double **)(left + 0x20);
    dVar3 = (double)**(int **)(right + 0x20);
    if (**(int **)(right + 0x20) < 0) {
      dVar3 = pow(10.0,-dVar3);
      dVar2 = round(dVar4 / dVar3);
      dVar2 = dVar2 * dVar3;
      dVar4 = 0.0;
    }
    else {
      dVar3 = pow(10.0,dVar3);
      dVar2 = round(dVar4 * dVar3);
      dVar2 = dVar2 / dVar3;
    }
    if ((ulong)ABS(dVar2) < 0x7ff0000000000000) {
      dVar4 = dVar2;
    }
    *pdVar1 = dVar4;
    return;
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}